

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O3

int __thiscall DIS::FastEntityStatePdu::getMarshalledSize(FastEntityStatePdu *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  pointer pVVar5;
  ulong uVar6;
  long lVar7;
  VariableParameter listElement;
  VariableParameter local_50;
  
  iVar3 = EntityInformationFamilyPdu::getMarshalledSize(&this->super_EntityInformationFamilyPdu);
  iVar3 = iVar3 + 0x84;
  pVVar5 = (this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_variableParameters).
      super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar5) {
    lVar7 = 8;
    uVar6 = 0;
    do {
      local_50._vptr_VariableParameter = (_func_int **)&PTR__VariableParameter_001b6670;
      local_50._24_7_ = SUB87((ulong)*(undefined8 *)(&pVVar5->field_0xf + lVar7) >> 8,0);
      puVar1 = (undefined8 *)((long)&pVVar5->_vptr_VariableParameter + lVar7);
      local_50._8_8_ = *puVar1;
      uVar2 = puVar1[1];
      local_50._variableParameterFields1._0_7_ = (undefined7)uVar2;
      local_50._variableParameterFields1._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
      iVar4 = VariableParameter::getMarshalledSize(&local_50);
      iVar3 = iVar3 + iVar4;
      VariableParameter::~VariableParameter(&local_50);
      uVar6 = uVar6 + 1;
      pVVar5 = (this->_variableParameters).
               super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x20;
    } while (uVar6 < (ulong)((long)(this->_variableParameters).
                                   super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 5));
  }
  return iVar3;
}

Assistant:

int FastEntityStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = EntityInformationFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 2;  // _site
   marshalSize = marshalSize + 2;  // _application
   marshalSize = marshalSize + 2;  // _entity
   marshalSize = marshalSize + 1;  // _forceId
   marshalSize = marshalSize + 1;  // _numberOfVariableParameters
   marshalSize = marshalSize + 1;  // _entityKind
   marshalSize = marshalSize + 1;  // _domain
   marshalSize = marshalSize + 2;  // _country
   marshalSize = marshalSize + 1;  // _category
   marshalSize = marshalSize + 1;  // _subcategory
   marshalSize = marshalSize + 1;  // _specific
   marshalSize = marshalSize + 1;  // _extra
   marshalSize = marshalSize + 1;  // _altEntityKind
   marshalSize = marshalSize + 1;  // _altDomain
   marshalSize = marshalSize + 2;  // _altCountry
   marshalSize = marshalSize + 1;  // _altCategory
   marshalSize = marshalSize + 1;  // _altSubcategory
   marshalSize = marshalSize + 1;  // _altSpecific
   marshalSize = marshalSize + 1;  // _altExtra
   marshalSize = marshalSize + 4;  // _xVelocity
   marshalSize = marshalSize + 4;  // _yVelocity
   marshalSize = marshalSize + 4;  // _zVelocity
   marshalSize = marshalSize + 8;  // _xLocation
   marshalSize = marshalSize + 8;  // _yLocation
   marshalSize = marshalSize + 8;  // _zLocation
   marshalSize = marshalSize + 4;  // _psi
   marshalSize = marshalSize + 4;  // _theta
   marshalSize = marshalSize + 4;  // _phi
   marshalSize = marshalSize + 4;  // _entityAppearance
   marshalSize = marshalSize + 1;  // _deadReckoningAlgorithm
   marshalSize = marshalSize + 15 * 1;  // _otherParameters
   marshalSize = marshalSize + 4;  // _xAcceleration
   marshalSize = marshalSize + 4;  // _yAcceleration
   marshalSize = marshalSize + 4;  // _zAcceleration
   marshalSize = marshalSize + 4;  // _xAngularVelocity
   marshalSize = marshalSize + 4;  // _yAngularVelocity
   marshalSize = marshalSize + 4;  // _zAngularVelocity
   marshalSize = marshalSize + 12 * 1;  // _marking
   marshalSize = marshalSize + 4;  // _capabilities

   for(unsigned long long idx=0; idx < _variableParameters.size(); idx++)
   {
        VariableParameter listElement = _variableParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}